

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DataDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DataDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,DataTypeSyntax *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4)

{
  Token semi;
  DataDeclarationSyntax *pDVar1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_RSI;
  DataTypeSyntax *in_RDI;
  TokenList *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  DataDeclarationSyntax *in_stack_00000010;
  undefined2 uStack0000000000000020;
  undefined1 uStack0000000000000022;
  undefined1 uStack0000000000000023;
  undefined4 uStack0000000000000024;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  pDVar1 = (DataDeclarationSyntax *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  semi.info = (Info *)args_4;
  semi.kind = uStack0000000000000020;
  semi._2_1_ = uStack0000000000000022;
  semi.numFlags.raw = uStack0000000000000023;
  semi.rawLen = uStack0000000000000024;
  slang::syntax::DataDeclarationSyntax::DataDeclarationSyntax
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,semi);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }